

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iuutil::StrInHelper::Assertion<char[13],char_const*>
          (AssertionResult *__return_storage_ptr__,StrInHelper *this,char *substr_str,
          char *actual_str,char (*substr) [13],char **actual)

{
  bool bVar1;
  AssertionResult *pAVar2;
  AssertionResult local_58;
  char (*local_30) [13];
  char **actual_local;
  char (*substr_local) [13];
  char *actual_str_local;
  char *substr_str_local;
  
  local_30 = substr;
  actual_local = (char **)actual_str;
  substr_local = (char (*) [13])substr_str;
  actual_str_local = (char *)this;
  substr_str_local = (char *)__return_storage_ptr__;
  bVar1 = Compare(actual_str,*(char **)*substr);
  if (bVar1) {
    iutest::AssertionSuccess();
  }
  else {
    iutest::AssertionFailure();
    pAVar2 = iutest::AssertionResult::operator<<(&local_58,(char (*) [18])"error: Expected: ");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [8])"strstr(");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char **)&substr_local);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [3])0x152910);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,&actual_str_local);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [10])") != NULL");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [12])"\n  Actual: ");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [9])"strstr(\"");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char **)local_30);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [4])"\", ");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [13])actual_local);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [10])") == NULL");
    iutest::AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    iutest::AssertionResult::~AssertionResult(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ Assertion(const char* substr_str, const char* actual_str
    , const T1& substr, const T2& actual)
{
    if( Compare(substr, actual) )
    {
        return ::iutest::AssertionSuccess();
    }

    return ::iutest::AssertionFailure() << "error: Expected: " << "strstr(" << actual_str << ", " << substr_str << ") != NULL"
        << "\n  Actual: " << "strstr(\"" << actual << "\", " << substr << ") == NULL";
}